

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcThrowErrorObject(NULLCRef error)

{
  NULLCRef error_00;
  NULLCRef error_01;
  undefined8 in_stack_00000008;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else if (NULLC::currExec == 1) {
    error_00.ptr._4_4_ = error.typeID;
    error_00._0_8_ = in_stack_00000008;
    ExecutorX86::Stop(NULLC::executorX86,error_00);
  }
  else if (NULLC::currExec == 0) {
    error_01.ptr._4_4_ = error.typeID;
    error_01._0_8_ = in_stack_00000008;
    ExecutorRegVm::Stop(NULLC::executorRegVm,error_01);
  }
  return;
}

Assistant:

void nullcThrowErrorObject(NULLCRef error)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		executorX86->Stop(error);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		executorRegVm->Stop(error);
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		executorLLVM->Stop(error);
#endif
	}
}